

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O2

EffectProps * __thiscall
anon_unknown.dwarf_15bad7::EqualizerStateFactory::getDefaultProps
          (EffectProps *__return_storage_ptr__,EqualizerStateFactory *this)

{
  *(float *)((long)__return_storage_ptr__ + 0x58) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x5c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x60) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 100) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->Reverb).LateReverbPan + 2) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x38) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[1] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[2] = 0.0;
  (__return_storage_ptr__->Reverb).LFReference = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x28) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x2c) = 0.0;
  *(bool *)((long)__return_storage_ptr__ + 0x30) = false;
  *(undefined3 *)((long)__return_storage_ptr__ + 0x31) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x34) = 0.0;
  *(int *)__return_storage_ptr__ = 0x43480000;
  *(int *)((long)__return_storage_ptr__ + 4) = 0x3f800000;
  *(float *)((long)__return_storage_ptr__ + 8) = 500.0;
  *(float *)((long)__return_storage_ptr__ + 0xc) = 1.0;
  *(float *)((long)__return_storage_ptr__ + 0x10) = 1.0;
  *(float *)((long)__return_storage_ptr__ + 0x14) = 3000.0;
  *(float *)((long)__return_storage_ptr__ + 0x18) = 1.0;
  *(float *)((long)__return_storage_ptr__ + 0x1c) = 1.0;
  *(float *)((long)__return_storage_ptr__ + 0x20) = 6000.0;
  *(float *)((long)__return_storage_ptr__ + 0x24) = 1.0;
  return __return_storage_ptr__;
}

Assistant:

EffectProps EqualizerStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Equalizer.LowCutoff = AL_EQUALIZER_DEFAULT_LOW_CUTOFF;
    props.Equalizer.LowGain = AL_EQUALIZER_DEFAULT_LOW_GAIN;
    props.Equalizer.Mid1Center = AL_EQUALIZER_DEFAULT_MID1_CENTER;
    props.Equalizer.Mid1Gain = AL_EQUALIZER_DEFAULT_MID1_GAIN;
    props.Equalizer.Mid1Width = AL_EQUALIZER_DEFAULT_MID1_WIDTH;
    props.Equalizer.Mid2Center = AL_EQUALIZER_DEFAULT_MID2_CENTER;
    props.Equalizer.Mid2Gain = AL_EQUALIZER_DEFAULT_MID2_GAIN;
    props.Equalizer.Mid2Width = AL_EQUALIZER_DEFAULT_MID2_WIDTH;
    props.Equalizer.HighCutoff = AL_EQUALIZER_DEFAULT_HIGH_CUTOFF;
    props.Equalizer.HighGain = AL_EQUALIZER_DEFAULT_HIGH_GAIN;
    return props;
}